

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void copy_suite::rotate_copy(void)

{
  basic_iterator<int> __first;
  basic_iterator<int> __last;
  basic_iterator<int> first_end;
  iterator_type *piVar1;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> __result;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> __first_00;
  basic_iterator<int> __last_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  allocator_type local_d1;
  vector<int,_std::allocator<int>_> local_d0;
  circular_view<int,_18446744073709551615UL> *local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> local_a8;
  undefined1 *local_88;
  ulong uStack_80;
  long local_78;
  ulong local_70;
  undefined1 local_68 [16];
  type local_58 [6];
  int local_40 [4];
  
  local_a8.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_a8.member.cap = 4;
  local_a8.member.size = 0;
  local_a8.member.next = 4;
  local_88 = (undefined1 *)0x160000000b;
  uStack_80 = 0x2c00000021;
  local_78 = CONCAT44(local_78._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input);
  local_88 = local_68;
  uStack_80 = 4;
  local_78 = 0;
  local_70 = 4;
  uVar4 = local_a8.member.next - local_a8.member.size;
  uVar2 = local_a8.member.cap * 2;
  uVar3 = uVar2 - (local_a8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar5 = uVar2 - 1 & uVar4;
  }
  else {
    uVar5 = uVar4 % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar2 - 1 & uVar4);
  }
  else {
    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar4 % uVar2);
  }
  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_a8;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                     ((basic_iterator<int> *)&local_d0);
  __last.parent = piVar1->parent;
  __last.current = piVar1->current;
  __first.parent = piVar1->parent;
  __first.current = piVar1->current;
  uVar2 = local_a8.member.cap * 2;
  if ((uVar2 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = local_a8.member.next % uVar2;
  }
  __last_00.current = uVar2;
  __last_00.parent = &local_a8;
  __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
                       (__first,__last_00,(circular_view<int,_18446744073709551615UL> *)&local_88);
  __first_00.current = uVar5;
  __first_00.parent = &local_a8;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
            (__first_00,__last,__result);
  local_40[0] = 0x21;
  local_40[1] = 0x2c;
  local_40[2] = 0x37;
  local_40[3] = 0x16;
  __l._M_len = 4;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,__l,&local_d1);
  uVar2 = uStack_80 * 2;
  uVar3 = uVar2 - (uStack_80 & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar2 - 1 & local_70 - local_78;
  }
  else {
    uVar4 = (local_70 - local_78) % uVar2;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_b0 = uVar2 - 1 & local_70;
  }
  else {
    sStack_b0 = local_70 % uVar2;
  }
  first_end.current = sStack_b0;
  first_end.parent = (circular_view<int,_18446744073709551615UL> *)&local_88;
  first_begin.current = uVar4;
  first_begin.parent = (circular_view<int,_18446744073709551615UL> *)&local_88;
  local_b8 = (circular_view<int,_18446744073709551615UL> *)&local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xba,"void copy_suite::rotate_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void rotate_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::rotate_copy(span.begin(), ++span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55, 22 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}